

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdi::ControlContainer::ControlContainer(ControlContainer *this,QMdiSubWindow *mdiChild)

{
  Data *pDVar1;
  ControlElement<QMdi::ControllerWidget> *this_00;
  Data *pDVar2;
  ControlElement<QMdi::ControlLabel> *this_01;
  QObject *pQVar3;
  QObject *pQVar4;
  QWidget *this_02;
  long in_FS_OFFSET;
  QObject local_60 [8];
  QObject local_58 [8];
  undefined1 local_50 [16];
  QObject local_40 [8];
  QObject local_38 [8];
  QWidgetData *local_30;
  
  local_30 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,(QObject *)mdiChild);
  *(undefined ***)this = &PTR_metaObject_008043e8;
  (this->previousLeft).wp.d = (Data *)0x0;
  (this->previousLeft).wp.value = (QObject *)0x0;
  (this->previousRight).wp.d = (Data *)0x0;
  (this->previousRight).wp.value = (QObject *)0x0;
  (this->m_menuBar).wp.d = (Data *)0x0;
  (this->m_menuBar).wp.value = (QObject *)0x0;
  (this->m_controllerWidget).wp.d = (Data *)0x0;
  (this->m_controllerWidget).wp.value = (QObject *)0x0;
  (this->m_menuLabel).wp.d = (Data *)0x0;
  (this->m_menuLabel).wp.value = (QObject *)0x0;
  if (mdiChild == (QMdiSubWindow *)0x0) {
    pDVar1 = (Data *)0x0;
  }
  else {
    pDVar1 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)mdiChild);
  }
  (this->mdiChild).wp.d = pDVar1;
  (this->mdiChild).wp.value = (QObject *)mdiChild;
  this_00 = (ControlElement<QMdi::ControllerWidget> *)operator_new(0x48);
  ControlElement<QMdi::ControllerWidget>::ControlElement(this_00,mdiChild);
  pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
  pDVar1 = (this->m_controllerWidget).wp.d;
  (this->m_controllerWidget).wp.d = pDVar2;
  (this->m_controllerWidget).wp.value = (QObject *)this_00;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this->m_controllerWidget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->m_controllerWidget).wp.value;
  }
  pQVar4 = (QObject *)0x0;
  QObject::connect(local_38,(char *)pQVar3,(QObject *)"2_q_close()",(char *)mdiChild,0x6811f6);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pDVar1 = (this->m_controllerWidget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->m_controllerWidget).wp.value;
    }
  }
  pQVar3 = (QObject *)0x0;
  QObject::connect(local_40,(char *)pQVar4,(QObject *)"2_q_restore()",(char *)mdiChild,0x6e9f28);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pDVar1 = (this->m_controllerWidget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this->m_controllerWidget).wp.value;
    }
  }
  QObject::connect((QObject *)(local_50 + 8),(char *)pQVar3,(QObject *)"2_q_minimize()",
                   (char *)mdiChild,0x6e9f45);
  QMetaObject::Connection::~Connection((Connection *)(local_50 + 8));
  this_01 = (ControlElement<QMdi::ControlLabel> *)operator_new(0x58);
  ControlElement<QMdi::ControlLabel>::ControlElement(this_01,mdiChild);
  pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_01);
  pDVar1 = (this->m_menuLabel).wp.d;
  (this->m_menuLabel).wp.d = pDVar2;
  (this->m_menuLabel).wp.value = (QObject *)this_01;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this->m_menuLabel).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    this_02 = (QWidget *)0x0;
  }
  else {
    this_02 = (QWidget *)(this->m_menuLabel).wp.value;
  }
  QWidget::windowIcon((QWidget *)local_50);
  QWidget::setWindowIcon(this_02,(QIcon *)local_50);
  QIcon::~QIcon((QIcon *)local_50);
  pDVar1 = (this->m_menuLabel).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->m_menuLabel).wp.value;
  }
  pQVar4 = (QObject *)0x0;
  QObject::connect(local_58,(char *)pQVar3,(QObject *)"2_q_clicked()",(char *)mdiChild,0x6e9f64);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pDVar1 = (this->m_menuLabel).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this->m_menuLabel).wp.value;
    }
  }
  QObject::connect(local_60,(char *)pQVar4,(QObject *)"2_q_doubleClicked()",(char *)mdiChild,
                   0x6811f6);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ControlContainer::ControlContainer(QMdiSubWindow *mdiChild)
    : QObject(mdiChild),
      previousLeft(nullptr),
      previousRight(nullptr),
#if QT_CONFIG(menubar)
      m_menuBar(nullptr),
#endif
      mdiChild(mdiChild)
{
    Q_ASSERT(mdiChild);

    m_controllerWidget = new ControlElement<ControllerWidget>(mdiChild);
    connect(m_controllerWidget, SIGNAL(_q_close()), mdiChild, SLOT(close()));
    connect(m_controllerWidget, SIGNAL(_q_restore()), mdiChild, SLOT(showNormal()));
    connect(m_controllerWidget, SIGNAL(_q_minimize()), mdiChild, SLOT(showMinimized()));

    m_menuLabel = new ControlElement<ControlLabel>(mdiChild);
    m_menuLabel->setWindowIcon(mdiChild->windowIcon());
#if QT_CONFIG(menu)
    connect(m_menuLabel, SIGNAL(_q_clicked()), mdiChild, SLOT(showSystemMenu()));
#endif
    connect(m_menuLabel, SIGNAL(_q_doubleClicked()), mdiChild, SLOT(close()));
}